

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void Fl_X::make_xid(Fl_Window *win,XVisualInfo *visual,Colormap colormap)

{
  Display *pDVar1;
  XVisualInfo *pXVar2;
  uint uVar3;
  int iVar4;
  __pid_t _Var5;
  Fl_Group *pFVar6;
  Fl_Window *pFVar7;
  Fl_X *pFVar8;
  Window WVar9;
  char *pcVar10;
  char *iname;
  size_t sVar11;
  Window WVar12;
  ulong in_stack_fffffffffffff9f8;
  undefined8 uVar13;
  undefined8 in_stack_fffffffffffffa08;
  undefined4 uVar14;
  Window local_5a8;
  undefined8 uStack_598;
  int old_event;
  Atom net_wm_type_kind;
  Atom net_wm_type;
  XWMHints *hints;
  long version;
  unsigned_long data [4];
  undefined8 local_550;
  Atom net_wm_state_skip_taskbar_1;
  Atom net_wm_state_1;
  Atom net_wm_state_skip_taskbar;
  Atom net_wm_state;
  Fl_Window *wp;
  char *pcStack_520;
  int len;
  char *xclass;
  char buffer [1024];
  long local_110;
  long pid;
  Fl_X *pFStack_100;
  int showit;
  Fl_X *xp;
  int local_f0;
  int sh;
  int sw;
  int sy;
  int sx;
  int mask;
  XSetWindowAttributes attr;
  ulong root;
  int fullscreen_right;
  int fullscreen_left;
  int fullscreen_bottom;
  int fullscreen_top;
  int bottom;
  int right;
  int left;
  int top;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  int H;
  int W;
  int Y;
  int X;
  Colormap colormap_local;
  XVisualInfo *visual_local;
  Fl_Window *win_local;
  
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffa08 >> 0x20);
  _Y = colormap;
  colormap_local = (Colormap)visual;
  visual_local = (XVisualInfo *)win;
  Fl_Group::current((Fl_Group *)0x0);
  W = Fl_Widget::x((Fl_Widget *)visual_local);
  H = Fl_Widget::y((Fl_Widget *)visual_local);
  scr_x = Fl_Widget::w((Fl_Widget *)visual_local);
  if (scr_x < 1) {
    scr_x = 1;
  }
  scr_y = Fl_Widget::h((Fl_Widget *)visual_local);
  if (scr_y < 1) {
    scr_y = 1;
  }
  pFVar6 = Fl_Widget::parent((Fl_Widget *)visual_local);
  if ((pFVar6 == (Fl_Group *)0x0) && (pFVar7 = Fl::grab(), pFVar7 == (Fl_Window *)0x0)) {
    in_stack_fffffffffffff9f8 = CONCAT44((int)(in_stack_fffffffffffff9f8 >> 0x20),scr_x);
    Fl::screen_xywh(&scr_w,&scr_h,&top,&left,W,H,scr_x,scr_y);
    uVar3 = Fl_Window::border((Fl_Window *)visual_local);
    if (uVar3 != 0) {
      if (scr_w + top < W + scr_x + 1) {
        W = (scr_w + top + -1) - scr_x;
      }
      if (W + -1 < scr_w) {
        W = scr_w + 1;
      }
      if (scr_h + left < H + scr_y + 1) {
        H = (scr_h + left + -1) - scr_y;
      }
      if (H + -0x14 < scr_h) {
        H = scr_h + 0x14;
      }
    }
    if (scr_w + top < W + scr_x) {
      W = (scr_w + top) - scr_x;
    }
    if (W < scr_w) {
      W = scr_w;
    }
    if (scr_h + left < H + scr_y) {
      H = (scr_h + left) - scr_y;
    }
    if (H < scr_h) {
      H = scr_h;
    }
  }
  pFVar6 = Fl_Widget::parent((Fl_Widget *)visual_local);
  if (pFVar6 != (Fl_Group *)0x0) {
    pFVar7 = Fl_Widget::window((Fl_Widget *)visual_local);
    pFVar8 = i(pFVar7);
    if (pFVar8 == (Fl_X *)0x0) {
      Fl_Widget::set_visible((Fl_Widget *)visual_local);
      return;
    }
  }
  fullscreen_left = Fl_Window::fullscreen_screen_top;
  fullscreen_right = Fl_Window::fullscreen_screen_bottom;
  root._4_4_ = Fl_Window::fullscreen_screen_left;
  root._0_4_ = Fl_Window::fullscreen_screen_right;
  if ((((Fl_Window::fullscreen_screen_top < 0) || (Fl_Window::fullscreen_screen_bottom < 0)) ||
      (Fl_Window::fullscreen_screen_left < 0)) || (Fl_Window::fullscreen_screen_right < 0)) {
    root._0_4_ = Fl::screen_num(W,H,scr_x,scr_y);
    root._4_4_ = (int)root;
    fullscreen_right = (int)root;
    fullscreen_left = (int)root;
  }
  pFVar6 = Fl_Widget::parent((Fl_Widget *)visual_local);
  if (pFVar6 == (Fl_Group *)0x0) {
    local_5a8 = *(Window *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
  }
  else {
    pFVar7 = Fl_Widget::window((Fl_Widget *)visual_local);
    local_5a8 = fl_xid(pFVar7);
  }
  attr.cursor = local_5a8;
  sy = 0x2818;
  pFVar6 = Fl_Widget::parent((Fl_Widget *)visual_local);
  iVar4 = 0x62c07f;
  if (pFVar6 != (Fl_Group *)0x0) {
    iVar4 = 0x8000;
  }
  attr._64_8_ = SEXT48(iVar4);
  attr._88_8_ = _Y;
  attr.border_pixmap = 0;
  attr.border_pixel._0_4_ = 0;
  uVar3 = Fl_Window::override((Fl_Window *)visual_local);
  if (uVar3 != 0) {
    attr.backing_pixel._0_4_ = 1;
    sy = sy | 0x600;
  }
  attr.do_not_propagate_mask._1_3_ = 0;
  attr.do_not_propagate_mask._0_1_ = uVar3 != 0;
  pFVar7 = Fl::grab();
  if (pFVar7 != (Fl_Window *)0x0) {
    attr.backing_pixel._0_4_ = 1;
    sy = sy | 0x400;
    uVar3 = Fl_Window::border((Fl_Window *)visual_local);
    if (uVar3 == 0) {
      attr.do_not_propagate_mask._0_4_ = 1;
      sy = sy | 0x200;
    }
  }
  uVar3 = Fl_Window::fullscreen_active((Fl_Window *)visual_local);
  if ((uVar3 != 0) && (iVar4 = ewmh_supported(), iVar4 == 0)) {
    attr.do_not_propagate_mask._0_4_ = 1;
    sy = sy | 0x200;
    Fl::screen_xywh(&sw,&sh,&local_f0,(int *)((long)&xp + 4),root._4_4_);
    W = sw;
    Fl::screen_xywh(&sw,&sh,&local_f0,(int *)((long)&xp + 4),(int)root);
    scr_x = (sw + local_f0) - W;
    Fl::screen_xywh(&sw,&sh,&local_f0,(int *)((long)&xp + 4),fullscreen_left);
    H = sh;
    Fl::screen_xywh(&sw,&sh,&local_f0,(int *)((long)&xp + 4),fullscreen_right);
    scr_y = (sh + xp._4_4_) - H;
  }
  pXVar2 = visual_local;
  if (-1 < fl_background_pixel) {
    attr.background_pixmap = (Pixmap)fl_background_pixel;
    fl_background_pixel = -1;
    sy = sy | 2;
  }
  WVar9 = XCreateWindow(fl_display,attr.cursor,W,H,scr_x,scr_y,
                        in_stack_fffffffffffff9f8 & 0xffffffff00000000,
                        *(undefined4 *)(colormap_local + 0x14),CONCAT44(uVar14,1),
                        *(undefined8 *)colormap_local,(long)sy,&sx);
  pFStack_100 = set_xid((Fl_Window *)pXVar2,WVar9);
  pid._4_4_ = 1;
  uVar14 = 0;
  XSetWMProperties(fl_display,pFStack_100->xid,0,0,0,0,0,0,0);
  _Var5 = getpid();
  local_110 = (long)_Var5;
  uVar13 = CONCAT44(uVar14,1);
  XChangeProperty(fl_display,pFStack_100->xid,fl_NET_WM_PID,6,0x20,0,&local_110,uVar13);
  uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
  pFVar6 = Fl_Widget::parent((Fl_Widget *)visual_local);
  pXVar2 = visual_local;
  if ((pFVar6 == (Fl_Group *)0x0) && ((uint)attr.do_not_propagate_mask == 0)) {
    pcVar10 = Fl_Window::label((Fl_Window *)visual_local);
    iname = Fl_Window::iconlabel((Fl_Window *)visual_local);
    Fl_Window::label((Fl_Window *)pXVar2,pcVar10,iname);
    uVar13 = CONCAT44(uVar14,1);
    XChangeProperty(fl_display,pFStack_100->xid,WM_PROTOCOLS,4,0x20,0,&WM_DELETE_WINDOW,uVar13);
    sendxjunk(pFStack_100);
    pcVar10 = Fl_Window::xclass((Fl_Window *)visual_local);
    uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
    if (pcVar10 != (char *)0x0) {
      pcStack_520 = Fl_Window::xclass((Fl_Window *)visual_local);
      sVar11 = strlen(pcStack_520);
      wp._4_4_ = (int)sVar11;
      strcpy((char *)&xclass,pcStack_520);
      strcpy(buffer + (long)wp._4_4_ + -7,pcStack_520);
      iVar4 = toupper((int)buffer[(long)(wp._4_4_ + 1) + -8]);
      buffer[(long)(wp._4_4_ + 1) + -8] = (char)iVar4;
      if (buffer[(long)(wp._4_4_ + 1) + -8] == 'X') {
        iVar4 = toupper((int)buffer[(long)(wp._4_4_ + 2) + -8]);
        buffer[(long)(wp._4_4_ + 2) + -8] = (char)iVar4;
      }
      uVar13 = CONCAT44(uVar14,wp._4_4_ * 2 + 2);
      XChangeProperty(fl_display,pFStack_100->xid,0x43,0x1f,8,0,&xclass,uVar13);
    }
    uVar3 = Fl_Window::non_modal((Fl_Window *)visual_local);
    uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
    if (((uVar3 != 0) && (pFStack_100->next != (Fl_X *)0x0)) && (fl_disable_transient_for == 0)) {
      net_wm_state = (Atom)pFStack_100->next->w;
      while( true ) {
        pFVar6 = Fl_Widget::parent((Fl_Widget *)net_wm_state);
        pDVar1 = fl_display;
        uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
        if (pFVar6 == (Fl_Group *)0x0) break;
        net_wm_state = (Atom)Fl_Widget::window((Fl_Widget *)net_wm_state);
      }
      WVar9 = pFStack_100->xid;
      WVar12 = fl_xid((Fl_Window *)net_wm_state);
      XSetTransientForHint(pDVar1,WVar9,WVar12);
      uVar3 = Fl_Widget::visible((Fl_Widget *)net_wm_state);
      if (uVar3 == 0) {
        pid._4_4_ = 0;
      }
      uVar3 = Fl_Window::modal((Fl_Window *)visual_local);
      if (uVar3 != 0) {
        net_wm_state_skip_taskbar = XInternAtom(fl_display,"_NET_WM_STATE",0);
        net_wm_state_1 = XInternAtom(fl_display,"_NET_WM_STATE_MODAL",0);
        uVar13 = CONCAT44(uVar14,1);
        XChangeProperty(fl_display,pFStack_100->xid,net_wm_state_skip_taskbar,4,0x20,2,
                        &net_wm_state_1,uVar13);
        uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
      }
    }
    uVar3 = Fl_Window::border((Fl_Window *)visual_local);
    if (uVar3 == 0) {
      net_wm_state_skip_taskbar_1 = XInternAtom(fl_display,"_NET_WM_STATE",0);
      local_550 = XInternAtom(fl_display,"_NET_WM_STATE_SKIP_TASKBAR",0);
      uVar13 = CONCAT44(uVar14,1);
      XChangeProperty(fl_display,pFStack_100->xid,net_wm_state_skip_taskbar_1,4,0x20,2,&local_550,
                      uVar13);
      uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
    }
    uVar3 = Fl_Window::fullscreen_active((Fl_Window *)visual_local);
    if ((uVar3 != 0) && (iVar4 = ewmh_supported(), iVar4 != 0)) {
      version = (long)fullscreen_left;
      data[0] = (unsigned_long)fullscreen_right;
      data[1] = (unsigned_long)root._4_4_;
      data[2] = (unsigned_long)(int)root;
      uVar13 = CONCAT44(uVar14,4);
      XChangeProperty(fl_display,pFStack_100->xid,fl_NET_WM_FULLSCREEN_MONITORS,4,0x20,0,&version,
                      uVar13);
      uVar13 = CONCAT44((int)((ulong)uVar13 >> 0x20),1);
      XChangeProperty(fl_display,pFStack_100->xid,fl_NET_WM_STATE,4,0x20,2,
                      &fl_NET_WM_STATE_FULLSCREEN,uVar13);
      uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
    }
    hints = (XWMHints *)&DAT_00000004;
    uVar13 = CONCAT44(uVar14,1);
    XChangeProperty(fl_display,pFStack_100->xid,fl_XdndAware,4,0x20,0,&hints,uVar13);
    uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
    net_wm_type = XAllocWMHints();
    *(undefined4 *)(net_wm_type + 8) = 1;
    *(ulong *)net_wm_type = 1;
    if (fl_show_iconic != '\0') {
      *(ulong *)net_wm_type = *(ulong *)net_wm_type | 2;
      *(undefined4 *)(net_wm_type + 0xc) = 3;
      fl_show_iconic = '\0';
      pid._4_4_ = 0;
    }
    if (**(long **)&visual_local[2].colormap_size != 0) {
      *(ulong *)(net_wm_type + 0x10) = **(ulong **)&visual_local[2].colormap_size;
      *(ulong *)net_wm_type = *(ulong *)net_wm_type | 4;
    }
    XSetWMHints(fl_display,pFStack_100->xid,net_wm_type);
    XFree(net_wm_type);
    set_icons(pFStack_100);
  }
  uVar3 = Fl_Window::menu_window((Fl_Window *)visual_local);
  if ((uVar3 != 0) || (uVar3 = Fl_Window::tooltip_window((Fl_Window *)visual_local), uVar3 != 0)) {
    net_wm_type_kind = XInternAtom(fl_display,"_NET_WM_WINDOW_TYPE",0);
    uStack_598 = XInternAtom(fl_display,"_NET_WM_WINDOW_TYPE_MENU",0);
    XChangeProperty(fl_display,pFStack_100->xid,net_wm_type_kind,4,0x20,0,&stack0xfffffffffffffa68,
                    CONCAT44(uVar14,1));
  }
  if (((have_xfixes & 1U) != 0) &&
     (pFVar6 = Fl_Widget::parent((Fl_Widget *)visual_local), pFVar6 == (Fl_Group *)0x0)) {
    XFixesSelectSelectionInput(fl_display,pFStack_100->xid,1);
    XFixesSelectSelectionInput(fl_display,pFStack_100->xid,CLIPBOARD,1);
  }
  if (Fl_Window::shape_data_ != (shape_data_type *)0x0) {
    Fl_Window::combine_mask((Fl_Window *)visual_local);
  }
  XMapWindow(fl_display,pFStack_100->xid);
  if (pid._4_4_ != 0) {
    Fl_Widget::set_visible((Fl_Widget *)visual_local);
    iVar4 = Fl::e_number;
    Fl::e_number = 0x10;
    (*(code *)visual_local->visual->red_mask)(visual_local,0x10);
    Fl::e_number = iVar4;
    Fl_Widget::redraw((Fl_Widget *)visual_local);
  }
  uVar3 = Fl_Window::fullscreen_active((Fl_Window *)visual_local);
  if ((uVar3 != 0) && (iVar4 = ewmh_supported(), iVar4 == 0)) {
    XGrabKeyboard(fl_display,pFStack_100->xid,1,1,1,fl_event_time);
  }
  return;
}

Assistant:

void Fl_X::make_xid(Fl_Window* win, XVisualInfo *visual, Colormap colormap)
{
  Fl_Group::current(0); // get rid of very common user bug: forgot end()

  int X = win->x();
  int Y = win->y();
  int W = win->w();
  if (W <= 0) W = 1; // X don't like zero...
  int H = win->h();
  if (H <= 0) H = 1; // X don't like zero...
  if (!win->parent() && !Fl::grab()) {
    // center windows in case window manager does not do anything:
#ifdef FL_CENTER_WINDOWS
    if (!win->force_position()) {
      win->x(X = scr_x+(scr_w-W)/2);
      win->y(Y = scr_y+(scr_h-H)/2);
    }
#endif // FL_CENTER_WINDOWS

    // force the window to be on-screen.  Usually the X window manager
    // does this, but a few don't, so we do it here for consistency:
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h, X, Y, W, H);

    if (win->border()) {
      // ensure border is on screen:
      // (assume extremely minimal dimensions for this border)
      const int top = 20;
      const int left = 1;
      const int right = 1;
      const int bottom = 1;
      if (X+W+right > scr_x+scr_w) X = scr_x+scr_w-right-W;
      if (X-left < scr_x) X = scr_x+left;
      if (Y+H+bottom > scr_y+scr_h) Y = scr_y+scr_h-bottom-H;
      if (Y-top < scr_y) Y = scr_y+top;
    }
    // now insure contents are on-screen (more important than border):
    if (X+W > scr_x+scr_w) X = scr_x+scr_w-W;
    if (X < scr_x) X = scr_x;
    if (Y+H > scr_y+scr_h) Y = scr_y+scr_h-H;
    if (Y < scr_y) Y = scr_y;
  }

  // if the window is a subwindow and our parent is not mapped yet, we
  // mark this window visible, so that mapping the parent at a later
  // point in time will call this function again to finally map the subwindow.
  if (win->parent() && !Fl_X::i(win->window())) {
    win->set_visible();
    return;
  }

  // Compute which screen(s) we should be on if we want to go fullscreen
  int fullscreen_top, fullscreen_bottom, fullscreen_left, fullscreen_right;

  fullscreen_top = win->fullscreen_screen_top;
  fullscreen_bottom = win->fullscreen_screen_bottom;
  fullscreen_left = win->fullscreen_screen_left;
  fullscreen_right = win->fullscreen_screen_right;

  if ((fullscreen_top < 0) || (fullscreen_bottom < 0) ||
      (fullscreen_left < 0) || (fullscreen_right < 0)) {
    fullscreen_top = Fl::screen_num(X, Y, W, H);
    fullscreen_bottom = fullscreen_top;
    fullscreen_left = fullscreen_top;
    fullscreen_right = fullscreen_top;
  }


  ulong root = win->parent() ?
    fl_xid(win->window()) : RootWindow(fl_display, fl_screen);

  XSetWindowAttributes attr;
  int mask = CWBorderPixel|CWColormap|CWEventMask|CWBitGravity;
  attr.event_mask = win->parent() ? childEventMask : XEventMask;
  attr.colormap = colormap;
  attr.border_pixel = 0;
  attr.bit_gravity = 0; // StaticGravity;
  if (win->override()) {
    attr.override_redirect = 1;
    attr.save_under = 1;
    mask |= CWOverrideRedirect | CWSaveUnder;
  } else attr.override_redirect = 0;
  if (Fl::grab()) {
    attr.save_under = 1; mask |= CWSaveUnder;
    if (!win->border()) {attr.override_redirect = 1; mask |= CWOverrideRedirect;}
  }
  // For the non-EWMH fullscreen case, we cannot use the code above,
  // since we do not want save_under, do not want to turn off the
  // border, and cannot grab without an existing window. Besides, 
  // there is no clear_override(). 
  if (win->fullscreen_active() && !Fl_X::ewmh_supported()) {
    int sx, sy, sw, sh;
    attr.override_redirect = 1;
    mask |= CWOverrideRedirect;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_left);
    X = sx;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_right);
    W = sx + sw - X;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_top);
    Y = sy;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_bottom);
    H = sy + sh - Y;
  }

  if (fl_background_pixel >= 0) {
    attr.background_pixel = fl_background_pixel;
    fl_background_pixel = -1;
    mask |= CWBackPixel;
  }

  Fl_X* xp =
    set_xid(win, XCreateWindow(fl_display,
                               root,
                               X, Y, W, H,
                               0, // borderwidth
                               visual->depth,
                               InputOutput,
                               visual->visual,
                               mask, &attr));
  int showit = 1;

  // Set WM_CLIENT_MACHINE and WM_LOCALE_NAME
  XSetWMProperties(fl_display, xp->xid, NULL, NULL, NULL, 0, NULL, NULL, NULL);

  // Set _NET_WM_PID
  long pid;
  pid = getpid();
  XChangeProperty(fl_display, xp->xid, fl_NET_WM_PID,
		  XA_CARDINAL, 32, 0, (unsigned char *)&pid, 1);

  if (!win->parent() && !attr.override_redirect) {
    // Communicate all kinds 'o junk to the X Window Manager:

    win->label(win->label(), win->iconlabel());

    XChangeProperty(fl_display, xp->xid, WM_PROTOCOLS,
                    XA_ATOM, 32, 0, (uchar*)&WM_DELETE_WINDOW, 1);

    // send size limits and border:
    xp->sendxjunk();

    // set the class property, which controls the icon used:
    if (win->xclass()) {
      char buffer[1024];
      const char *xclass = win->xclass();
      const int len = strlen(xclass);
      // duplicate the xclass string for use as XA_WM_CLASS
      strcpy(buffer, xclass);
      strcpy(buffer + len + 1, xclass);
      // create the capitalized version:
      buffer[len + 1] = toupper(buffer[len + 1]);
      if (buffer[len + 1] == 'X')
        buffer[len + 2] = toupper(buffer[len + 2]);
      XChangeProperty(fl_display, xp->xid, XA_WM_CLASS, XA_STRING, 8, 0,
                      (unsigned char *)buffer, len * 2 + 2);
    }

    if (win->non_modal() && xp->next && !fl_disable_transient_for) {
      // find some other window to be "transient for":
      Fl_Window* wp = xp->next->w;
      while (wp->parent()) wp = wp->window();
      XSetTransientForHint(fl_display, xp->xid, fl_xid(wp));
      if (!wp->visible()) showit = 0; // guess that wm will not show it
      if (win->modal()) {
        Atom net_wm_state = XInternAtom (fl_display, "_NET_WM_STATE", 0);
        Atom net_wm_state_skip_taskbar = XInternAtom (fl_display, "_NET_WM_STATE_MODAL", 0);
        XChangeProperty (fl_display, xp->xid, net_wm_state, XA_ATOM, 32,
            PropModeAppend, (unsigned char*) &net_wm_state_skip_taskbar, 1);
      }
    }

    // Make sure that borderless windows do not show in the task bar
    if (!win->border()) {
      Atom net_wm_state = XInternAtom (fl_display, "_NET_WM_STATE", 0);
      Atom net_wm_state_skip_taskbar = XInternAtom (fl_display, "_NET_WM_STATE_SKIP_TASKBAR", 0);
      XChangeProperty (fl_display, xp->xid, net_wm_state, XA_ATOM, 32,
          PropModeAppend, (unsigned char*) &net_wm_state_skip_taskbar, 1);
    }

    // If asked for, create fullscreen
    if (win->fullscreen_active() && Fl_X::ewmh_supported()) {
      unsigned long data[4];
      data[0] = fullscreen_top;
      data[1] = fullscreen_bottom;
      data[2] = fullscreen_left;
      data[3] = fullscreen_right;
      XChangeProperty (fl_display, xp->xid, fl_NET_WM_FULLSCREEN_MONITORS, XA_ATOM, 32,
                       PropModeReplace, (unsigned char*) data, 4);
      XChangeProperty (fl_display, xp->xid, fl_NET_WM_STATE, XA_ATOM, 32,
                       PropModeAppend, (unsigned char*) &fl_NET_WM_STATE_FULLSCREEN, 1);
    }

    // Make it receptive to DnD:
    long version = 4;
    XChangeProperty(fl_display, xp->xid, fl_XdndAware,
                    XA_ATOM, sizeof(int)*8, 0, (unsigned char*)&version, 1);

    XWMHints *hints = XAllocWMHints();
    hints->input = True;
    hints->flags = InputHint;
    if (fl_show_iconic) {
      hints->flags |= StateHint;
      hints->initial_state = IconicState;
      fl_show_iconic = 0;
      showit = 0;
    }
    if (win->icon_->legacy_icon) {
      hints->icon_pixmap = (Pixmap)win->icon_->legacy_icon;
      hints->flags       |= IconPixmapHint;
    }
    XSetWMHints(fl_display, xp->xid, hints);
    XFree(hints);

    xp->set_icons();
  }

  // set the window type for menu and tooltip windows to avoid animations (compiz)
  if (win->menu_window() || win->tooltip_window()) {
    Atom net_wm_type = XInternAtom(fl_display, "_NET_WM_WINDOW_TYPE", False);
    Atom net_wm_type_kind = XInternAtom(fl_display, "_NET_WM_WINDOW_TYPE_MENU", False);
    XChangeProperty(fl_display, xp->xid, net_wm_type, XA_ATOM, 32, PropModeReplace, (unsigned char*)&net_wm_type_kind, 1);
  }

#if HAVE_XFIXES
  // register for clipboard change notifications
  if (have_xfixes && !win->parent()) {
    XFixesSelectSelectionInput(fl_display, xp->xid, XA_PRIMARY,
                               XFixesSetSelectionOwnerNotifyMask);
    XFixesSelectSelectionInput(fl_display, xp->xid, CLIPBOARD,
                               XFixesSetSelectionOwnerNotifyMask);
  }
#endif

  if (win->shape_data_) {
    win->combine_mask();
    }
  XMapWindow(fl_display, xp->xid);
  if (showit) {
    win->set_visible();
    int old_event = Fl::e_number;
    win->handle(Fl::e_number = FL_SHOW); // get child windows to appear
    Fl::e_number = old_event;
    win->redraw();
  }

  // non-EWMH fullscreen case, need grab
  if (win->fullscreen_active() && !Fl_X::ewmh_supported()) {
    XGrabKeyboard(fl_display, xp->xid, 1, GrabModeAsync, GrabModeAsync, fl_event_time);
  }

}